

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O0

void __thiscall Assimp::Importer::GetMemoryRequirements(Importer *this,aiMemoryInfo *in)

{
  aiScene *paVar1;
  aiTexture *paVar2;
  aiAnimation *paVar3;
  aiNodeAnim *paVar4;
  aiMaterial *paVar5;
  bool bVar6;
  uint uVar7;
  uint local_94;
  uint a_3;
  aiMaterial *pc_2;
  uint i_3;
  aiNodeAnim *pc2;
  uint a_2;
  aiAnimation *pc_1;
  uint i_2;
  aiTexture *pc;
  uint local_50;
  uint i_1;
  uint p;
  uint a_1;
  uint a;
  uint i;
  aiScene *mScene;
  uint local_30;
  uint uStack_2c;
  uint local_28;
  uint uStack_24;
  uint local_20;
  uint uStack_1c;
  aiMemoryInfo *local_18;
  aiMemoryInfo *in_local;
  Importer *this_local;
  
  local_18 = in;
  in_local = (aiMemoryInfo *)this;
  aiMemoryInfo::aiMemoryInfo((aiMemoryInfo *)&mScene);
  *(aiScene **)local_18 = mScene;
  local_18->meshes = local_30;
  local_18->nodes = uStack_2c;
  local_18->animations = local_28;
  local_18->cameras = uStack_24;
  local_18->lights = local_20;
  local_18->total = uStack_1c;
  paVar1 = this->pimpl->mScene;
  if (this->pimpl->mScene != (aiScene *)0x0) {
    local_18->total = 0x80;
    for (a_1 = 0; a_1 < paVar1->mNumMeshes; a_1 = a_1 + 1) {
      local_18->meshes = local_18->meshes + 0x520;
      bVar6 = aiMesh::HasPositions(paVar1->mMeshes[a_1]);
      if (bVar6) {
        local_18->meshes = local_18->meshes + paVar1->mMeshes[a_1]->mNumVertices * 0xc;
      }
      bVar6 = aiMesh::HasNormals(paVar1->mMeshes[a_1]);
      if (bVar6) {
        local_18->meshes = local_18->meshes + paVar1->mMeshes[a_1]->mNumVertices * 0xc;
      }
      bVar6 = aiMesh::HasTangentsAndBitangents(paVar1->mMeshes[a_1]);
      if (bVar6) {
        local_18->meshes = local_18->meshes + paVar1->mMeshes[a_1]->mNumVertices * 0x18;
      }
      p = 0;
      while ((p < 8 && (bVar6 = aiMesh::HasVertexColors(paVar1->mMeshes[a_1],p), bVar6))) {
        local_18->meshes = local_18->meshes + paVar1->mMeshes[a_1]->mNumVertices * 0x10;
        p = p + 1;
      }
      i_1 = 0;
      while ((i_1 < 8 && (bVar6 = aiMesh::HasTextureCoords(paVar1->mMeshes[a_1],i_1), bVar6))) {
        local_18->meshes = local_18->meshes + paVar1->mMeshes[a_1]->mNumVertices * 0xc;
        i_1 = i_1 + 1;
      }
      bVar6 = aiMesh::HasBones(paVar1->mMeshes[a_1]);
      if (bVar6) {
        local_18->meshes = local_18->meshes + paVar1->mMeshes[a_1]->mNumBones * 8;
        for (local_50 = 0; local_50 < paVar1->mMeshes[a_1]->mNumBones; local_50 = local_50 + 1) {
          local_18->meshes = local_18->meshes + 0x450;
          local_18->meshes =
               local_18->meshes + paVar1->mMeshes[a_1]->mBones[local_50]->mNumWeights * 8;
        }
      }
      local_18->meshes = local_18->meshes + paVar1->mMeshes[a_1]->mNumFaces * 0x1c;
    }
    local_18->total = local_18->meshes + local_18->total;
    for (pc._4_4_ = 0; pc._4_4_ < paVar1->mNumTextures; pc._4_4_ = pc._4_4_ + 1) {
      paVar2 = paVar1->mTextures[pc._4_4_];
      local_18->textures = local_18->textures + 0x428;
      if (paVar2->mHeight == 0) {
        local_18->textures = paVar2->mWidth + local_18->textures;
      }
      else {
        local_18->textures = paVar2->mHeight * 4 * paVar2->mWidth + local_18->textures;
      }
    }
    local_18->total = local_18->textures + local_18->total;
    for (pc_1._4_4_ = 0; pc_1._4_4_ < paVar1->mNumAnimations; pc_1._4_4_ = pc_1._4_4_ + 1) {
      paVar3 = paVar1->mAnimations[pc_1._4_4_];
      local_18->animations = local_18->animations + 0x448;
      for (pc2._4_4_ = 0; pc2._4_4_ < paVar3->mNumChannels; pc2._4_4_ = pc2._4_4_ + 1) {
        paVar4 = paVar3->mChannels[pc_1._4_4_];
        local_18->animations = local_18->animations + 0x438;
        local_18->animations = local_18->animations + paVar4->mNumPositionKeys * 0x18;
        local_18->animations = local_18->animations + paVar4->mNumScalingKeys * 0x18;
        local_18->animations = local_18->animations + paVar4->mNumRotationKeys * 0x18;
      }
    }
    local_18->total = local_18->animations + local_18->total;
    uVar7 = paVar1->mNumCameras * 0x438;
    local_18->cameras = uVar7;
    local_18->total = uVar7 + local_18->total;
    uVar7 = paVar1->mNumLights * 0x46c;
    local_18->lights = uVar7;
    local_18->total = uVar7 + local_18->total;
    AddNodeWeight(&local_18->nodes,paVar1->mRootNode);
    local_18->total = local_18->nodes + local_18->total;
    for (pc_2._4_4_ = 0; pc_2._4_4_ < paVar1->mNumMaterials; pc_2._4_4_ = pc_2._4_4_ + 1) {
      paVar5 = paVar1->mMaterials[pc_2._4_4_];
      local_18->materials = local_18->materials + 0x10;
      local_18->materials = local_18->materials + paVar5->mNumAllocated * 8;
      for (local_94 = 0; local_94 < paVar5->mNumProperties; local_94 = local_94 + 1) {
        local_18->materials = paVar5->mProperties[local_94]->mDataLength + local_18->materials;
      }
    }
    local_18->total = local_18->materials + local_18->total;
  }
  return;
}

Assistant:

void Importer::GetMemoryRequirements(aiMemoryInfo& in) const
{
    in = aiMemoryInfo();
    aiScene* mScene = pimpl->mScene;

    // return if we have no scene loaded
    if (!pimpl->mScene)
        return;


    in.total = sizeof(aiScene);

    // add all meshes
    for (unsigned int i = 0; i < mScene->mNumMeshes;++i)
    {
        in.meshes += sizeof(aiMesh);
        if (mScene->mMeshes[i]->HasPositions()) {
            in.meshes += sizeof(aiVector3D) * mScene->mMeshes[i]->mNumVertices;
        }

        if (mScene->mMeshes[i]->HasNormals()) {
            in.meshes += sizeof(aiVector3D) * mScene->mMeshes[i]->mNumVertices;
        }

        if (mScene->mMeshes[i]->HasTangentsAndBitangents()) {
            in.meshes += sizeof(aiVector3D) * mScene->mMeshes[i]->mNumVertices * 2;
        }

        for (unsigned int a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS;++a) {
            if (mScene->mMeshes[i]->HasVertexColors(a)) {
                in.meshes += sizeof(aiColor4D) * mScene->mMeshes[i]->mNumVertices;
            }
            else break;
        }
        for (unsigned int a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS;++a) {
            if (mScene->mMeshes[i]->HasTextureCoords(a)) {
                in.meshes += sizeof(aiVector3D) * mScene->mMeshes[i]->mNumVertices;
            }
            else break;
        }
        if (mScene->mMeshes[i]->HasBones()) {
            in.meshes += sizeof(void*) * mScene->mMeshes[i]->mNumBones;
            for (unsigned int p = 0; p < mScene->mMeshes[i]->mNumBones;++p) {
                in.meshes += sizeof(aiBone);
                in.meshes += mScene->mMeshes[i]->mBones[p]->mNumWeights * sizeof(aiVertexWeight);
            }
        }
        in.meshes += (sizeof(aiFace) + 3 * sizeof(unsigned int))*mScene->mMeshes[i]->mNumFaces;
    }
    in.total += in.meshes;

    // add all embedded textures
    for (unsigned int i = 0; i < mScene->mNumTextures;++i) {
        const aiTexture* pc = mScene->mTextures[i];
        in.textures += sizeof(aiTexture);
        if (pc->mHeight) {
            in.textures += 4 * pc->mHeight * pc->mWidth;
        }
        else in.textures += pc->mWidth;
    }
    in.total += in.textures;

    // add all animations
    for (unsigned int i = 0; i < mScene->mNumAnimations;++i) {
        const aiAnimation* pc = mScene->mAnimations[i];
        in.animations += sizeof(aiAnimation);

        // add all bone anims
        for (unsigned int a = 0; a < pc->mNumChannels; ++a) {
            const aiNodeAnim* pc2 = pc->mChannels[i];
            in.animations += sizeof(aiNodeAnim);
            in.animations += pc2->mNumPositionKeys * sizeof(aiVectorKey);
            in.animations += pc2->mNumScalingKeys * sizeof(aiVectorKey);
            in.animations += pc2->mNumRotationKeys * sizeof(aiQuatKey);
        }
    }
    in.total += in.animations;

    // add all cameras and all lights
    in.total += in.cameras = sizeof(aiCamera) *  mScene->mNumCameras;
    in.total += in.lights  = sizeof(aiLight)  *  mScene->mNumLights;

    // add all nodes
    AddNodeWeight(in.nodes,mScene->mRootNode);
    in.total += in.nodes;

    // add all materials
    for (unsigned int i = 0; i < mScene->mNumMaterials;++i) {
        const aiMaterial* pc = mScene->mMaterials[i];
        in.materials += sizeof(aiMaterial);
        in.materials += pc->mNumAllocated * sizeof(void*);

        for (unsigned int a = 0; a < pc->mNumProperties;++a) {
            in.materials += pc->mProperties[a]->mDataLength;
        }
    }
    in.total += in.materials;
}